

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

int currentpc(CallInfo *ci)

{
  lua_CFunction p_Var1;
  long lVar2;
  int iVar3;
  char *__assertion;
  
  if ((ci->callstatus & 2) == 0) {
    __assert_fail("((ci)->callstatus & (1<<1))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                  ,0x2e,"int currentpc(CallInfo *)");
  }
  if (ci->func->tt_ == 0x8006) {
    p_Var1 = (ci->func->value_).f;
    if (p_Var1[8] == (_func_int_lua_State_ptr)0x6) {
      lVar2 = *(long *)(*(long *)(p_Var1 + 0x18) + 0x38);
      if (lVar2 == 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = (int)((ulong)((long)(ci->u).l.savedpc - lVar2) >> 2) + -1;
      }
      return iVar3;
    }
    __assertion = "((((ci)->func)->value_).gc)->tt == ((6) | ((0) << 4))";
  }
  else {
    __assertion = "(((((ci)->func))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                ,0x30,"int currentpc(CallInfo *)");
}

Assistant:

static int currentpc (CallInfo *ci) {
  lua_assert(isLua(ci));
  /* If this function was compiled using the source to JIT then no code available */
  if (ci_func(ci)->p->code == NULL)
    return 0;
  return pcRel(ci->u.l.savedpc, ci_func(ci)->p);
}